

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O0

int lua_sj_get_label(char *name)

{
  bool bVar1;
  char *local_28;
  char *n;
  int positionsAdded;
  aint val;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = -1;
  }
  else {
    _positionsAdded = name;
    n._0_4_ = addLuaSourcePositions();
    local_28 = _positionsAdded;
    bVar1 = GetLabelValue(&local_28,(aint *)((long)&n + 4));
    if (!bVar1) {
      n._4_4_ = -1;
    }
    removeLuaSourcePositions((int)n);
    name_local._4_4_ = n._4_4_;
  }
  return name_local._4_4_;
}

Assistant:

static int lua_sj_get_label(const char *name) {
	if (nullptr == name) return -1;
	aint val;
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	char* n = const_cast<char*>(name);	//TODO try to get rid of const_cast, LuaBridge requires const char* to understand it as lua string
	if (!GetLabelValue(n, val)) val = -1;
	removeLuaSourcePositions(positionsAdded);
	return val;
}